

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

vector<Vec2,_std::allocator<Vec2>_> * __thiscall
Router::Route(vector<Vec2,_std::allocator<Vec2>_> *__return_storage_ptr__,Router *this,Vec2 start,
             Vec2 end)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  int iVar7;
  float fVar8;
  float local_a430;
  float local_a3fc;
  Vec2 *local_a3e8;
  int local_a398;
  int local_a394;
  int i_4;
  int i_3;
  int i_2;
  int v_1;
  Vec2 local_a380;
  value_type local_a378;
  Vec2 local_a370;
  Vec2 local_a368;
  int local_a360;
  int local_a35c;
  int v;
  int u;
  int iStack_a350;
  bool flag;
  int j;
  int i_1;
  int i;
  bool used [100];
  int aiStack_a2d8 [2];
  int prev [100];
  Vec2 vertex [100];
  float edges [100] [100];
  float dis [100];
  int Points;
  Vec2 local_44;
  Router *local_38;
  undefined1 local_29;
  Router *local_28;
  Router *this_local;
  Vec2 end_local;
  Vec2 start_local;
  vector<Vec2,_std::allocator<Vec2>_> *res;
  
  local_29 = 0;
  local_28 = this;
  this_local = (Router *)end;
  end_local = start;
  std::vector<Vec2,_std::allocator<Vec2>_>::vector(__return_storage_ptr__);
  local_38 = this_local;
  bVar3 = Reachable(this,(Vec2)this_local);
  if (bVar3) {
    local_44 = Vec2::operator-((Vec2 *)&this_local,&end_local);
    fVar8 = Vec2::length(&local_44);
    if (0.0001 <= fVar8) {
      iVar2 = this->VertexCount;
      local_a3e8 = (Vec2 *)(prev + 0x62);
      do {
        Vec2::Vec2(local_a3e8,0.0,0.0);
        local_a3e8 = local_a3e8 + 1;
      } while (local_a3e8 != vertex + 99);
      for (j = 0; j < iVar2; j = j + 1) {
        pvVar4 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](&this->Vertexes,(long)j);
        vertex[(long)j + -1] = *pvVar4;
      }
      vertex[(long)iVar2 + -1] = end_local;
      iVar7 = iVar2 + 2;
      vertex[(long)(iVar2 + 1) + -1] = (Vec2)this_local;
      for (iStack_a350 = 0; iStack_a350 < iVar7; iStack_a350 = iStack_a350 + 1) {
        aiStack_a2d8[iStack_a350] = -1;
        *(undefined1 *)((long)&i_1 + (long)iStack_a350) = 0;
        local_a3fc = 0.0;
        if (iStack_a350 != this->VertexCount) {
          local_a3fc = 1e+08;
        }
        dis[(long)iStack_a350 + -2] = local_a3fc;
        edges[(long)iStack_a350 + -1][(long)iStack_a350 + 0x62] = 0.0;
        u = iStack_a350;
        while (u = u + 1, u < iVar7) {
          if ((iStack_a350 < this->VertexCount) && (u < this->VertexCount)) {
            this_00 = std::
                      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ::operator[](&this->Edges,(long)iStack_a350);
            pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)u);
            vVar1 = *pvVar5;
            edges[(long)u + -1][(long)iStack_a350 + 0x62] = vVar1;
            edges[(long)iStack_a350 + -1][(long)u + 0x62] = vVar1;
          }
          else {
            v._3_1_ = 1;
            for (local_a35c = 0; local_a35c < this->ObstacleCount; local_a35c = local_a35c + 1) {
              for (local_a360 = 0; local_a360 < 4; local_a360 = local_a360 + 1) {
                local_a368 = vertex[(long)iStack_a350 + -1];
                local_a370 = vertex[(long)u + -1];
                pvVar6 = std::
                         vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                         ::operator[](&this->Obstacles,(long)local_a35c);
                pvVar4 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                                   (pvVar6,(long)local_a360);
                local_a378 = *pvVar4;
                pvVar6 = std::
                         vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                         ::operator[](&this->Obstacles,(long)local_a35c);
                pvVar4 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                                   (pvVar6,(ulong)(local_a360 + 1U & 3));
                local_a380.x = pvVar4->x;
                local_a380.y = pvVar4->y;
                bVar3 = intersect(local_a368,local_a370,local_a378,local_a380);
                if (bVar3) {
                  v._3_1_ = 0;
                  break;
                }
              }
              if ((v._3_1_ & 1) == 0) break;
            }
            if ((v._3_1_ & 1) == 0) {
              local_a430 = 1e+08;
            }
            else {
              _i_2 = Vec2::operator-(vertex + (long)iStack_a350 + -1,vertex + (long)u + -1);
              local_a430 = Vec2::length((Vec2 *)&i_2);
            }
            edges[(long)u + -1][(long)iStack_a350 + 0x62] = local_a430;
            edges[(long)iStack_a350 + -1][(long)u + 0x62] = local_a430;
          }
        }
      }
      while( true ) {
        i_3 = -1;
        for (i_4 = 0; i_4 < iVar7; i_4 = i_4 + 1) {
          if (((*(byte *)((long)&i_1 + (long)i_4) & 1) == 0) &&
             ((i_3 == -1 || (dis[(long)i_4 + -2] < dis[(long)i_3 + -2])))) {
            i_3 = i_4;
          }
        }
        if (i_3 == -1) break;
        *(undefined1 *)((long)&i_1 + (long)i_3) = 1;
        for (local_a394 = 0; local_a394 < iVar7; local_a394 = local_a394 + 1) {
          if (dis[(long)i_3 + -2] + edges[(long)i_3 + -1][(long)local_a394 + 0x62] <
              dis[(long)local_a394 + -2]) {
            dis[(long)local_a394 + -2] =
                 dis[(long)i_3 + -2] + edges[(long)i_3 + -1][(long)local_a394 + 0x62];
            aiStack_a2d8[local_a394] = i_3;
          }
        }
      }
      for (local_a398 = iVar2 + 1; local_a398 != iVar2; local_a398 = aiStack_a2d8[local_a398]) {
        std::vector<Vec2,_std::allocator<Vec2>_>::push_back
                  (__return_storage_ptr__,vertex + (long)local_a398 + -1);
      }
      __first = std::vector<Vec2,_std::allocator<Vec2>_>::begin(__return_storage_ptr__);
      __last = std::vector<Vec2,_std::allocator<Vec2>_>::end(__return_storage_ptr__);
      std::reverse<__gnu_cxx::__normal_iterator<Vec2*,std::vector<Vec2,std::allocator<Vec2>>>>
                ((__normal_iterator<Vec2_*,_std::vector<Vec2,_std::allocator<Vec2>_>_>)
                 __first._M_current,
                 (__normal_iterator<Vec2_*,_std::vector<Vec2,_std::allocator<Vec2>_>_>)
                 __last._M_current);
    }
    else {
      std::vector<Vec2,_std::allocator<Vec2>_>::push_back
                (__return_storage_ptr__,(value_type *)&this_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> Router::Route(Vec2 start, Vec2 end)
{
    std::vector<Vec2> res;
    if (!Reachable(end))
        return res;
    if ((end - start).length() < EPS)
    {
        res.push_back(end);
        return res;
    }

    int Points = VertexCount;

    float dis[MAX_POINTS];					//起点到该点的最短距离
	float edges[MAX_POINTS][MAX_POINTS];    //边权
	Vec2 vertex[MAX_POINTS];			    //参与最短路计算的点的坐标
	int prev[MAX_POINTS];					//点的前驱，回溯最短路用
	bool used[MAX_POINTS];                  //点是否已松弛过

    for (int i = 0; i < Points; ++i)
        vertex[i] = Vertexes[i];
    vertex[Points++] = start;
    vertex[Points++] = end;

    for (int i = 0; i < Points; ++i)
    {
        prev[i] = -1;
        used[i] = false;
        dis[i] = (i == VertexCount ? 0 : FINF);
        edges[i][i] = 0;
        for (int j = i + 1; j < Points; ++j)
        {
            if (i < VertexCount && j < VertexCount)
            {
                edges[i][j] = edges[j][i] = Edges[i][j];
                continue;
            }
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(vertex[i], vertex[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
						flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            edges[i][j] = edges[j][i] = (flag ? (vertex[i] - vertex[j]).length() : FINF);
        }
    }

    //Dijkstra
    while (true)
    {
        int v = -1;
        for (int i = 0; i < Points; ++i)
            if (!used[i] && (v == -1 || dis[i] < dis[v]))
                v = i;
		if (v == -1)
            break;
        used[v] = true;
        for (int i = 0; i < Points; ++i)
            if (dis[i] > dis[v] + edges[v][i])
            {
                dis[i] = dis[v] + edges[v][i];
                prev[i] = v;
            }
    }

	for (int i = Points - 1; i != Points - 2; i = prev[i])
        res.push_back(vertex[i]);
    reverse(res.begin(), res.end());
    return res;
}